

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagCode.cpp
# Opt level: O3

span<const_slang::DiagCode,_18446744073709551615UL> slang::findDiagsFromOptionName(string_view name)

{
  char *pcVar1;
  uint uVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint64_t uVar13;
  pointer pDVar14;
  ulong uVar15;
  long lVar16;
  __extent_storage<18446744073709551615UL> _Var17;
  char *in_RSI;
  size_t in_RDI;
  long lVar18;
  ulong uVar19;
  size_type __rlen;
  undefined1 auVar20 [16];
  span<const_slang::DiagCode,_18446744073709551615UL> sVar21;
  size_t pos;
  value_type *elements;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_len = in_RDI;
  local_40._M_str = in_RSI;
  uVar13 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &optionMap,&local_40);
  lVar10 = DAT_006eb6d0;
  lVar9 = DAT_006eb6c8;
  uVar8 = DAT_006eb6c0;
  uVar15 = uVar13 >> (optionMap & 0x3f);
  lVar16 = (uVar13 & 0xff) * 4;
  cVar4 = (&UNK_0051239c)[lVar16];
  cVar5 = (&UNK_0051239d)[lVar16];
  cVar6 = (&UNK_0051239e)[lVar16];
  bVar7 = (&UNK_0051239f)[lVar16];
  uVar19 = 0;
  do {
    pcVar1 = (char *)(lVar9 + uVar15 * 0x10);
    bVar3 = pcVar1[0xf];
    auVar20[0] = -(*pcVar1 == cVar4);
    auVar20[1] = -(pcVar1[1] == cVar5);
    auVar20[2] = -(pcVar1[2] == cVar6);
    auVar20[3] = -(pcVar1[3] == bVar7);
    auVar20[4] = -(pcVar1[4] == cVar4);
    auVar20[5] = -(pcVar1[5] == cVar5);
    auVar20[6] = -(pcVar1[6] == cVar6);
    auVar20[7] = -(pcVar1[7] == bVar7);
    auVar20[8] = -(pcVar1[8] == cVar4);
    auVar20[9] = -(pcVar1[9] == cVar5);
    auVar20[10] = -(pcVar1[10] == cVar6);
    auVar20[0xb] = -(pcVar1[0xb] == bVar7);
    auVar20[0xc] = -(pcVar1[0xc] == cVar4);
    auVar20[0xd] = -(pcVar1[0xd] == cVar5);
    auVar20[0xe] = -(pcVar1[0xe] == cVar6);
    auVar20[0xf] = -(bVar3 == bVar7);
    uVar12 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
    if (uVar12 != 0) {
      lVar16 = lVar10 + uVar15 * 600;
      do {
        uVar2 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        lVar18 = (ulong)uVar2 * 0x28;
        if (local_40._M_len == *(size_t *)(lVar16 + lVar18)) {
          if (local_40._M_len != 0) {
            iVar11 = bcmp(local_40._M_str,*(void **)(lVar16 + 8 + lVar18),local_40._M_len);
            if (iVar11 != 0) goto LAB_00150f40;
          }
          pDVar14 = *(pointer *)(lVar16 + lVar18 + 0x10);
          _Var17._M_extent_value = *(long *)(lVar16 + lVar18 + 0x18) - (long)pDVar14 >> 2;
          goto LAB_00150f9a;
        }
LAB_00150f40:
        uVar12 = uVar12 - 1 & uVar12;
      } while (uVar12 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar13 & 7] & bVar3) == 0) break;
    lVar16 = uVar15 + uVar19;
    uVar19 = uVar19 + 1;
    uVar15 = lVar16 + 1U & uVar8;
  } while (uVar19 <= uVar8);
  _Var17._M_extent_value = 0;
  pDVar14 = (pointer)0x0;
LAB_00150f9a:
  sVar21._M_extent._M_extent_value = _Var17._M_extent_value;
  sVar21._M_ptr = pDVar14;
  return sVar21;
}

Assistant:

std::span<const DiagCode> findDiagsFromOptionName(std::string_view name) {
    if (auto it = optionMap.find(name); it != optionMap.end())
        return it->second;
    return {};
}